

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::Database(Database *this,string *fname,bool initialize)

{
  _Rb_tree_header *p_Var1;
  path fpath;
  path local_f0;
  path local_b0;
  path local_70;
  
  (this->db_name)._M_pathname._M_dataplus._M_p = (pointer)&(this->db_name)._M_pathname.field_2;
  (this->db_name)._M_pathname._M_string_length = 0;
  (this->db_name)._M_pathname.field_2._M_local_buf[0] = '\0';
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->db_name)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->db_name)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->db_base)._M_pathname._M_dataplus._M_p = (pointer)&(this->db_base)._M_pathname.field_2;
  (this->db_base)._M_pathname._M_string_length = 0;
  (this->db_base)._M_pathname.field_2._M_local_buf[0] = '\0';
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->db_base)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->db_base)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  p_Var1 = &(this->iterators)._M_t._M_impl.super__Rb_tree_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DatabaseConfig::DatabaseConfig(&this->config_);
  this->last_task_id = 0;
  (this->tasks)._M_h._M_buckets = &(this->tasks)._M_h._M_single_bucket;
  (this->tasks)._M_h._M_bucket_count = 1;
  (this->tasks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tasks)._M_h._M_element_count = 0;
  (this->tasks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tasks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tasks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_b0,fname);
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&local_f0);
  std::experimental::filesystem::v1::absolute((v1 *)&local_70,&local_b0,&local_f0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_f0,&local_70);
  std::experimental::filesystem::v1::__cxx11::path::filename(&local_b0,&local_f0);
  std::experimental::filesystem::v1::__cxx11::path::operator=(&this->db_name,&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_f0,&local_70);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::operator=(&this->db_base,&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
  if (initialize) {
    load_from_disk(this);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  return;
}

Assistant:

Database::Database(const std::string &fname, bool initialize)
    : last_task_id(0) {
    fs::path fpath = fs::absolute(fname);
    db_name = fs::path(fpath).filename();
    db_base = fs::path(fpath).parent_path();

    if (initialize) {
        load_from_disk();
    }
}